

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  int iVar1;
  ptls_buffer_t *buf_00;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int ret;
  uint8_t smallbuf [256];
  ptls_buffer_t buf;
  void *in_stack_fffffffffffffe78;
  ptls_buffer_t *in_stack_fffffffffffffe80;
  void *src;
  ptls_buffer_t *in_stack_fffffffffffffe88;
  void *output;
  ptls_hash_algorithm_t *algo;
  undefined4 in_stack_fffffffffffffea0;
  uint16_t in_stack_fffffffffffffeae;
  ptls_buffer_t *in_stack_fffffffffffffeb0;
  ptls_iovec_t in_stack_fffffffffffffeb8;
  long local_50;
  void *local_40;
  
  ptls_buffer_init(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0x1182d9);
  algo = (ptls_hash_algorithm_t *)0x2;
  src = (void *)0x2;
  iVar1 = ptls_buffer__do_pushv
                    (in_stack_fffffffffffffe88,(void *)0x2,(size_t)in_stack_fffffffffffffe78);
  if ((iVar1 == 0) &&
     (output = local_40,
     iVar1 = ptls_buffer__do_pushv(in_stack_fffffffffffffe88,src,(size_t)in_stack_fffffffffffffe78),
     iVar1 == 0)) {
    buf_00 = (ptls_buffer_t *)((long)local_40 - (long)output);
    if (algo == (ptls_hash_algorithm_t *)0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)0xffffffffffffffff,(size_t)output)
      ;
      if (iVar1 != 0) goto LAB_00118487;
    }
    else {
      for (; algo != (ptls_hash_algorithm_t *)0x0;
          algo = (ptls_hash_algorithm_t *)(algo[-1].empty_digest + 0x3f)) {
        *(char *)((long)output + (local_50 - (long)algo)) =
             (char)((ulong)buf_00 >> (((char)algo + -1) * '\b' & 0x3fU));
      }
      algo = (ptls_hash_algorithm_t *)0x0;
    }
    iVar1 = push_key_share_entry
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae,in_stack_fffffffffffffeb8
                      );
    if (((iVar1 == 0) &&
        (iVar1 = ptls_buffer__do_pushv(buf_00,src,(size_t)in_stack_fffffffffffffe78), iVar1 == 0))
       && (iVar1 = ptls_calc_hash(algo,output,buf_00,(size_t)src), iVar1 == 0)) {
      iVar1 = 0;
    }
  }
LAB_00118487:
  ptls_buffer_dispose((ptls_buffer_t *)CONCAT44(iVar1,in_stack_fffffffffffffea0));
  return iVar1;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}